

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O0

RC __thiscall
QL_Manager::JoinRelationWithQO
          (QL_Manager *this,QL_Node **topNode,QO_Rel *qorels,QL_Node *currNode,int qoIdx)

{
  RelAttr *pRVar1;
  char **ppcVar2;
  int relIndex_00;
  RelCatEntry *pRVar3;
  Condition *pCVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Condition condition;
  Condition *pCVar7;
  QL_NodeRel *this_00;
  int *attrs;
  mapped_type *pmVar8;
  QL_NodeJoin *this_01;
  long lVar9;
  key_type local_e0;
  int local_dc;
  int i_2;
  int otherAttr;
  char *pcStack_d0;
  char *local_c8;
  char *pcStack_c0;
  int local_b4;
  int local_b0;
  int index2;
  int index1;
  int index;
  int condIdx;
  QL_NodeJoin *joinNode;
  int numConds;
  int i_1;
  int start;
  string relString;
  int i;
  int *attrList;
  QL_NodeRel *relNode;
  int relIndex;
  RC rc;
  int qoIdx_local;
  QL_Node *currNode_local;
  QO_Rel *qorels_local;
  QL_Node **topNode_local;
  QL_Manager *this_local;
  
  relIndex_00 = qorels[qoIdx].relIdx;
  this_00 = (QL_NodeRel *)operator_new(0x120);
  QL_NodeRel::QL_NodeRel(this_00,this,this->relEntries + relIndex_00);
  attrs = (int *)malloc((long)this->relEntries[relIndex_00].attrCount << 2);
  memset(attrs,0,8);
  for (relString.field_2._12_4_ = 0;
      (int)relString.field_2._12_4_ < this->relEntries[relIndex_00].attrCount;
      relString.field_2._12_4_ = relString.field_2._12_4_ + 1) {
    attrs[(int)relString.field_2._12_4_] = 0;
  }
  pRVar3 = this->relEntries;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&start,pRVar3[relIndex_00].relName,(allocator *)((long)&i_1 + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 3));
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->relToAttrIndex,(key_type *)&start);
  numConds = *pmVar8;
  for (joinNode._4_4_ = 0; joinNode._4_4_ < this->relEntries[relIndex_00].attrCount;
      joinNode._4_4_ = joinNode._4_4_ + 1) {
    attrs[joinNode._4_4_] = numConds + joinNode._4_4_;
  }
  QL_NodeRel::SetUpNode(this_00,attrs,this->relEntries[relIndex_00].attrCount);
  free(attrs);
  CountNumConditions(this,relIndex_00,(int *)&joinNode);
  this_01 = (QL_NodeJoin *)operator_new(0x70);
  QL_NodeJoin::QL_NodeJoin(this_01,this,currNode,(QL_Node *)this_00);
  _condIdx = this_01;
  this_local._4_4_ = QL_NodeJoin::SetUpNode(this_01,(int)joinNode);
  if (this_local._4_4_ != 0) goto LAB_00119cb5;
  *topNode = &_condIdx->super_QL_Node;
  if (qorels[qoIdx].indexAttr != -1) {
    index1 = qorels[qoIdx].indexCond;
    index2 = qorels[qoIdx].indexAttr;
    local_b0 = 0;
    local_b4 = 0;
    pCVar4 = this->condptr + index1;
    local_c8 = (pCVar4->lhsAttr).relName;
    pcStack_c0 = (pCVar4->lhsAttr).attrName;
    GetAttrCatEntryPos(this,pCVar4->lhsAttr,&local_b0);
    if (this->condptr[index1].bRhsIsAttr != 0) {
      pRVar1 = &this->condptr[index1].rhsAttr;
      _i_2 = pRVar1->relName;
      pcStack_d0 = pRVar1->attrName;
      GetAttrCatEntryPos(this,*pRVar1,&local_b4);
    }
    if (local_b0 == index2) {
      local_dc = local_b4;
    }
    else {
      local_dc = local_b0;
    }
    if ((this->attrEntries[index2].indexNo == -1) || (this->condptr[index1].bRhsIsAttr != 0)) {
      if ((this->attrEntries[index2].indexNo == -1) || (this->condptr[index1].bRhsIsAttr == 0))
      goto LAB_00119b84;
      this_local._4_4_ =
           QL_NodeJoin::UseIndexJoin(_condIdx,local_dc,index2,this->attrEntries[index2].indexNo);
    }
    else {
      this_local._4_4_ =
           (*(this_00->super_QL_Node)._vptr_QL_Node[8])
                     (this_00,(ulong)(uint)index2,(ulong)(uint)this->attrEntries[index2].indexNo,
                      this->condptr[index1].rhsValue.data);
    }
    if (this_local._4_4_ != 0) goto LAB_00119cb5;
  }
LAB_00119b84:
  for (local_e0 = 0; local_e0 < this->nConds; local_e0 = local_e0 + 1) {
    pmVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](&this->conditionToRel,&local_e0);
    if (*pmVar8 == relIndex_00) {
      pCVar4 = this->condptr;
      lVar9 = (long)local_e0;
      pCVar7 = pCVar4 + lVar9;
      uVar5 = pCVar7->op;
      uVar6 = pCVar7->bRhsIsAttr;
      condition.bRhsIsAttr = uVar6;
      condition.op = uVar5;
      ppcVar2 = &pCVar4[lVar9].rhsAttr.attrName;
      condition.lhsAttr = pCVar4[lVar9].lhsAttr;
      condition.rhsAttr.relName = ((RelAttr *)(&pCVar7->op + 2))->relName;
      condition.rhsAttr.attrName = *ppcVar2;
      condition.rhsValue._0_8_ = ppcVar2[1];
      condition.rhsValue.data = pCVar4[lVar9].rhsValue.data;
      this_local._4_4_ = QL_Node::AddCondition(*topNode,condition,local_e0);
      if (this_local._4_4_ != 0) goto LAB_00119cb5;
    }
  }
  this_local._4_4_ = 0;
LAB_00119cb5:
  index = 1;
  std::__cxx11::string::~string((string *)&start);
  return this_local._4_4_;
}

Assistant:

RC QL_Manager::JoinRelationWithQO(QL_Node *&topNode, QO_Rel* qorels, QL_Node *currNode, int qoIdx){
  RC rc = 0;
  int relIndex = qorels[qoIdx].relIdx;
  // create new relation node, providing the relation entry
  QL_NodeRel *relNode = new QL_NodeRel(*this, relEntries + relIndex);

  // Set up the list of indices corresponding to attributes in the relation
  int *attrList = (int *)malloc(relEntries[relIndex].attrCount * sizeof(int));
  memset((void *)attrList, 0, sizeof(attrList));
  for(int i = 0;  i < relEntries[relIndex].attrCount ; i++){
    attrList[i] = 0;
  }
  string relString(relEntries[relIndex].relName);
  int start = relToAttrIndex[relString]; // get the offset of the first attr in this relation
  for(int i = 0;  i < relEntries[relIndex].attrCount ; i++){
    attrList[i] = start + i;
  }
  // Set up the relation node by providing the attribute list and # of attributes
  relNode->SetUpNode(attrList, relEntries[relIndex].attrCount);
  free(attrList);

  // Count the # of conditions associated with this attribute
  int numConds;
  CountNumConditions(relIndex, numConds);

  // create new join node:
  QL_NodeJoin *joinNode = new QL_NodeJoin(*this, *currNode, *relNode);
  if((rc = joinNode->SetUpNode(numConds))) // provide a max count on # of conditions
    return (rc);                           // to add to this join
  topNode = joinNode;

  if(qorels[qoIdx].indexAttr != -1){
    int condIdx = qorels[qoIdx].indexCond;
    int index = qorels[qoIdx].indexAttr;
    int index1 = 0;
    int index2 = 0;
    GetAttrCatEntryPos(condptr[condIdx].lhsAttr, index1);
    if(condptr[condIdx].bRhsIsAttr)
      GetAttrCatEntryPos(condptr[condIdx].rhsAttr, index2);
    int otherAttr;
    if(index1 == index)
      otherAttr = index2;
    else
      otherAttr = index1;
    if((attrEntries[index].indexNo != -1) && !condptr[condIdx].bRhsIsAttr){ // add only if there is an index on this attribute
      //cout << "adding index join on attr " << index; 
      if((rc = relNode->UseIndex(index, attrEntries[index].indexNo, condptr[condIdx].rhsValue.data) ))
        return (rc);
    }
    else if((attrEntries[index].indexNo != -1) && condptr[condIdx].bRhsIsAttr){
      //cout << "adding, lhs attr: " << otherAttr << ", rhsATtr: " << index << endl;
      if((rc = joinNode->UseIndexJoin(otherAttr, index, attrEntries[index].indexNo)))
        return (rc);
    }
  }
  for(int i = 0 ; i < nConds; i++){
    if(conditionToRel[i] == relIndex){
      if((rc = topNode->AddCondition(condptr[i], i) ))
        return (rc);
    }
  }
  return (0);
}